

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

string * __thiscall
wallet::LabelFromValue_abi_cxx11_(string *__return_storage_ptr__,wallet *this,UniValue *value)

{
  pointer pcVar1;
  int iVar2;
  string *this_00;
  UniValue *__return_storage_ptr___00;
  long in_FS_OFFSET;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (LabelFromValue[abi:cxx11](UniValue_const&)::empty_string_abi_cxx11_ == '\0') {
    LabelFromValue_abi_cxx11_();
  }
  if (*(int *)this == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    this_00 = &LabelFromValue[abi:cxx11](UniValue_const&)::empty_string_abi_cxx11_;
  }
  else {
    this_00 = UniValue::get_str_abi_cxx11_((UniValue *)this);
    iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (this_00,"*");
    if (iVar2 == 0) {
      __return_storage_ptr___00 = (UniValue *)__cxa_allocate_exception(0x58);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Invalid label name","");
      JSONRPCError(__return_storage_ptr___00,-0xb,&local_48);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        __cxa_throw(__return_storage_ptr___00,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_0032233f;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  }
  pcVar1 = (this_00->_M_dataplus)._M_p;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + this_00->_M_string_length);
    return __return_storage_ptr__;
  }
LAB_0032233f:
  __stack_chk_fail();
}

Assistant:

std::string LabelFromValue(const UniValue& value)
{
    static const std::string empty_string;
    if (value.isNull()) return empty_string;

    const std::string& label{value.get_str()};
    if (label == "*")
        throw JSONRPCError(RPC_WALLET_INVALID_LABEL_NAME, "Invalid label name");
    return label;
}